

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

double __thiscall sophia_interface::LUZDIS(sophia_interface *this,int KFL1,int KFL2,double PR)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  sophia_interface *psVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  sophia_interface *this_00;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_78;
  
  this_00 = (sophia_interface *)(ulong)(uint)-KFL1;
  if (0 < KFL1) {
    this_00 = (sophia_interface *)(ulong)(uint)KFL1;
  }
  uVar7 = -KFL2;
  if (0 < KFL2) {
    uVar7 = KFL2;
  }
  psVar4 = this_00;
  if (9 < (uint)this_00) {
    psVar4 = (sophia_interface *)
             (ulong)(uint)((int)((ulong)this_00 / 1000) + (int)((ulong)this_00 / 10000) * -10);
  }
  uVar3 = (uint)psVar4;
  if (MSTJ[10] != 1) {
    if ((MSTJ[10] < 4) && (3 < uVar3 || MSTJ[10] != 3)) {
      lVar6 = 0x1d0;
      if (MSTJ[0x5a] != 1) {
        lVar6 = (ulong)(uVar3 + (uVar3 == 0)) * 8 + 0x188;
      }
      dVar1 = *(double *)((long)PARJ + lVar6);
      do {
        dVar18 = RLU(this_00,false);
        if (dVar1 < 0.0 || 1.0 < dVar1) {
          if (dVar1 <= -1.0 || 0.0 <= dVar1) {
            if (0.0 < dVar1) {
              dVar18 = pow(dVar18,1.0 / dVar1);
              dVar18 = 1.0 - dVar18;
            }
            if (dVar1 < 0.0) {
              dVar18 = pow(dVar18,-1.0 / dVar1);
            }
            goto LAB_0012b878;
          }
          dVar19 = 1.0 - dVar18;
          bVar2 = false;
          dVar11 = RLU(this_00,false);
          dVar10 = dVar19 * dVar19 + dVar18 * -dVar1;
          if (dVar1 * -4.0 * dVar18 * dVar19 * dVar19 < dVar10 * dVar10 * dVar11) {
            bVar2 = true;
          }
        }
        else {
          bVar2 = false;
          dVar10 = RLU(this_00,false);
          if (dVar10 < dVar1) {
            dVar18 = pow(dVar18,0.3333333333333333);
            dVar18 = 1.0 - dVar18;
LAB_0012b878:
            bVar2 = false;
          }
        }
        if (!bVar2) {
          return dVar18;
        }
      } while( true );
    }
  }
  pdVar9 = PARJ + 0x28;
  pdVar8 = PARJ + 0x29;
  if (MSTJ[0x5a] == 1) {
    pdVar9 = PARJ + 0x2a;
    pdVar8 = PARJ + 0x2b;
  }
  dVar1 = 1.0;
  if (9 < (uint)this_00) {
    dVar1 = 1.0 - PARJ[0x2c];
  }
  dVar18 = *pdVar9;
  if (9 < uVar7) {
    dVar18 = dVar18 + PARJ[0x2c];
    dVar1 = dVar1 + PARJ[0x2c];
  }
  if ((MSTJ[10] < 4) || ((uVar3 & 0xe) != 4)) {
    if ((MSTJ[10] < 4) || (2 < uVar3 - 6)) goto LAB_0012b8d0;
    dVar10 = PARJ[(ulong)(MSTJ[10] == 5) * 2 + 0x2d];
    piVar5 = KCHG[2] + (long)(int)uVar3 * 2 + 0x1f2;
  }
  else {
    this_00 = (sophia_interface *)(ulong)(uVar3 == 5 && MSTJ[10] == 5);
    dVar10 = PARJ[(long)((long)this_00->K[0] + 0x29)];
    piVar5 = (int *)(PARF + (long)((long)psVar4->K[0] + 0x5f));
  }
  dVar1 = dVar1 + dVar10 * *pdVar8 * *(double *)piVar5 * *(double *)piVar5;
LAB_0012b8d0:
  dVar19 = *pdVar8 * PR;
  dVar10 = ABS(dVar1 + -1.0);
  if (dVar18 < 0.02) {
    if (dVar1 <= dVar19) {
      dVar11 = 1.0;
    }
    else {
      dVar11 = dVar19 / dVar1;
    }
  }
  else if (0.01 <= ABS(dVar1 - dVar18)) {
    dVar11 = (dVar19 - dVar1) * (dVar19 - dVar1) + dVar18 * 4.0 * dVar19;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar12 = (((dVar19 + dVar1) - dVar11) * 0.5) / (dVar1 - dVar18);
    dVar11 = dVar12;
    if (((0.9999 < dVar12) && (100.0 < dVar19)) &&
       (dVar11 = 1.0 - dVar18 / dVar19, dVar12 <= dVar11)) {
      dVar11 = dVar12;
    }
  }
  else {
    dVar11 = dVar19 / (dVar19 + dVar1);
  }
  if (0.1 <= dVar11) {
    bVar2 = false;
    dVar12 = 0.0;
    if (dVar11 <= 0.85) {
      dVar13 = 0.0;
      local_78 = 0.0;
    }
    else {
      dVar13 = 0.0;
      local_78 = 0.0;
      if (1.0 < dVar19) {
        dVar13 = dVar1 / dVar19;
        dVar12 = dVar13 * dVar13 + 4.0;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        dVar14 = log((dVar13 + dVar12) * dVar11 * 0.5);
        dVar12 = (-1.0 / dVar11 + dVar12) - dVar14 * dVar13;
        if (0.02 <= dVar18) {
          dVar13 = log(1.0 - dVar11);
          dVar12 = dVar12 + dVar13 * (dVar18 / dVar19);
        }
        dVar13 = 0.0;
        if (dVar12 <= 0.0) {
          dVar12 = 0.0;
        }
        if (dVar11 <= dVar12) {
          dVar12 = dVar11;
        }
        local_78 = (1.0 - dVar12) * dVar19 + 1.0;
        bVar2 = true;
      }
    }
  }
  else {
    dVar12 = dVar11 * 2.75;
    if (0.01 < dVar10) {
      dVar13 = pow(dVar12,1.0 - dVar1);
      local_78 = (1.0 - 1.0 / dVar13) / (dVar1 + -1.0) + 1.0;
    }
    else {
      local_78 = log(dVar12);
      local_78 = 1.0 - local_78;
      dVar13 = 0.0;
    }
    bVar2 = false;
  }
  do {
    dVar14 = RLU(this_00,false);
    if (0.1 <= dVar11) {
      if (bVar2) {
        dVar15 = RLU(this_00,false);
        if (1.0 < dVar15 * local_78) {
          dVar14 = dVar14 * (1.0 - dVar12) + dVar12;
          goto LAB_0012bd1d;
        }
        dVar14 = log(dVar14);
        dVar14 = dVar14 / dVar19 + dVar12;
        dVar15 = exp((dVar14 - dVar12) * dVar19);
      }
      else {
        dVar15 = 1.0;
      }
    }
    else {
      dVar15 = RLU(this_00,false);
      if (dVar15 * local_78 <= 1.0) {
        dVar14 = dVar14 * dVar12;
LAB_0012bd1d:
        dVar15 = 1.0;
      }
      else if (0.01 < dVar10) {
        dVar14 = pow(dVar14 * (1.0 - dVar13) + dVar13,1.0 / (1.0 - dVar1));
        dVar14 = 1.0 / dVar14;
        dVar15 = pow(dVar12 / dVar14,dVar1);
      }
      else {
        dVar14 = pow(dVar12,dVar14);
        dVar15 = dVar12 / dVar14;
      }
    }
    if ((0.0 < dVar14) && (dVar14 < 1.0)) {
      dVar16 = log(dVar11 / dVar14);
      dVar16 = dVar16 * dVar1 + (-1.0 / dVar14 + 1.0 / dVar11) * dVar19;
      if (0.02 <= dVar18) {
        dVar17 = log((1.0 - dVar14) / (1.0 - dVar11));
        dVar16 = dVar16 + dVar17 * dVar18;
      }
      if (50.0 <= dVar16) {
        dVar16 = 50.0;
      }
      if (dVar16 <= -50.0) {
        dVar16 = -50.0;
      }
      dVar16 = exp(dVar16);
      dVar17 = RLU(this_00,false);
      if (dVar15 * dVar17 <= dVar16) {
        return dVar14;
      }
    }
  } while( true );
}

Assistant:

double sophia_interface::LUZDIS(int KFL1, int KFL2, double PR) {
// Purpose: to generate the longitudinal splitting variable Z.
    double Z = 0.;

    // Check if heavy flavour fragmentation. 
    int KFLA = std::abs(KFL1);
    int KFLB = std::abs(KFL2);
    int KFLH = KFLA;
    if (KFLA >= 10) KFLH = (KFLA / 1000) % 10;
 
    // Lund symmetric scaling function: determine parameters of shape. 
    if (MSTJ[10] == 1 || (MSTJ[10] == 3 && KFLH <= 3) || MSTJ[10] >= 4) {
        double FA = PARJ[40];
        if (MSTJ[90] == 1) FA = PARJ[42];
        if (KFLB >= 10) FA += PARJ[44];
        double FBB = PARJ[41];
        if (MSTJ[90] == 1) FBB = PARJ[43];
        double FB = FBB * PR;
        double FC = 1.;
        if (KFLA >= 10) FC -= PARJ[44];
        if (KFLB >= 10) FC += PARJ[44];
        if (MSTJ[10] >= 4 && KFLH >= 4 && KFLH <= 5) {
            double FRED = PARJ[45];
            if (MSTJ[10] == 5 && KFLH == 5) FRED = PARJ[46];
            FC += FRED * FBB * PARF[100 + KFLH - 1] * PARF[100 + KFLH - 1];
        } else if (MSTJ[10] >= 4 && KFLH >= 6 && KFLH <= 8) {
            double FRED = PARJ[45];
            if (MSTJ[10] == 5) FRED = PARJ[47];
            FC += FRED * FBB * PMAS[0][KFLH - 1] * PMAS[0][KFLH - 1];
        }
        int MC = 1;
        if (std::abs(FC - 1.) > 0.01) MC = 2;
 
        // Determine position of maximum. Special cases for a  =  0 or a  =  c. 
        double ZMAX = 0.;
        int MA = 0;
        if (FA < 0.02) {
            MA = 1;
            ZMAX = 1.;
            if (FC > FB) ZMAX = FB / FC;
        } else if (std::abs(FC-FA) < 0.01) {
            MA = 2;
            ZMAX = FB / (FB + FC);
        } else {
            MA = 3;
            ZMAX = 0.5 * (FB + FC - std::sqrt((FB - FC) * (FB - FC) + 4. * FA * FB)) / (FC - FA);
            if ((ZMAX > 0.9999) && (FB > 100.)) ZMAX = std::min(ZMAX, 1. - FA / FB);
        }
 
        // Subdivide z range if distribution very peaked near endpoint. 
        int MMAX = 2;
        double ZDIV = 0.;
        double FINT = 0.;
        double ZDIVC = 0.;
        if (ZMAX < 0.1) {
            MMAX = 1;
            ZDIV = 2.75 * ZMAX;
            if (MC == 1) {
                FINT = 1. - std::log(ZDIV);
            } else {
                ZDIVC = std::pow(ZDIV, 1. - FC);
                FINT = 1. + (1. - 1. / ZDIVC) / (FC - 1.);
            }
        } else if (ZMAX > 0.85 && FB > 1.) {
            MMAX = 3;
            double FSCB = std::sqrt(4. + (FC / FB) * (FC / FB));
            ZDIV = FSCB - 1. / ZMAX - (FC / FB) * std::log(ZMAX * 0.5 * (FSCB + FC / FB));
            if (MA >= 2) ZDIV += (FA / FB) * std::log(1. - ZMAX);
            ZDIV = std::min(ZMAX, std::max(0., ZDIV));
            FINT = 1. + FB * (1. - ZDIV);
        }

        // Choice of z, preweighted for peaks at low or high z.
        bool repeat100 = false;
        do {  // 100
            repeat100 = false;
            Z = RLU();
            double FPRE = 1.;
            if (MMAX == 1) {
                if (FINT * RLU() <= 1.) {
                    Z *= ZDIV;
                } else if (MC == 1) {
                    Z = std::pow(ZDIV, Z);
                    FPRE = ZDIV / Z;
                } else {
                    Z = 1. / std::pow(ZDIVC + Z * (1. - ZDIVC), 1. / (1. - FC));
                    FPRE = std::pow(ZDIV / Z, FC);
                }
            } else if (MMAX == 3) {
                if (FINT * RLU() <= 1.) {
                    Z = ZDIV + std::log(Z) / FB;
                    FPRE = std::exp(FB * (Z - ZDIV));
                } else {
                    Z = ZDIV + Z * (1. - ZDIV);
                }
            }

            // Weighting according to correct formula.
            if (Z <= 0. || Z >= 1.) {repeat100 = true; continue;}
            double FEXP = FC * std::log(ZMAX / Z) + FB * (1. / ZMAX - 1. / Z);
            if (MA >= 2) FEXP += FA * std::log((1. - Z) / (1. - ZMAX));
            double FVAL = std::exp(std::max(-50., std::min(50., FEXP)));
            if (FVAL < RLU() * FPRE) {repeat100 = true; continue;}
        } while (repeat100);

    // Generate z according to Field-Feynman, SLAC, (1-z)^c OR z^c.
    } else {
        double FC = PARJ[50 + std::max(1, KFLH) - 1];
        if (MSTJ[90] == 1) FC = PARJ[58];
        bool repeat110 = false;
        do {  // 110
            repeat110 = false;
            Z = RLU();
            if (FC >= 0. && FC <= 1.) {
                if (FC > RLU()) Z = 1. - std::pow(Z, 1. / 3.);
            } else if (FC > -1 && FC < 0.) {
                if (-4. * FC * Z * (1. - Z) * (1. - Z) < RLU() * std::pow((1. - Z) * (1. - Z) - FC * Z, 2)) {repeat110 = true; continue;}
            } else {
                if (FC > 0.) Z = 1. - std::pow(Z, (1. / FC));
                if (FC < 0.) Z = std::pow(Z, (-1. / FC));
            }
        } while (repeat110);
    }
    return Z;
}